

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_warn_undefs_op(sexp ctx,sexp self,sexp_sint_t n,sexp from,sexp to,sexp res)

{
  sexp psVar1;
  sexp ls;
  
  ls = (sexp)&DAT_0000023e;
  if ((((ulong)res & 3) == 0 && res != (sexp)0x0) && (res->tag == 0x13)) {
    ls = (res->value).type.slots;
  }
  if ((((ulong)from & 3) == 0) && (from->tag == 0x17)) {
    from = (from->value).type.slots;
  }
  for (; ((((ulong)from & 3) == 0 && (from != to)) && (from->tag == 6));
      from = (from->value).type.slots) {
    if (((((from->value).type.cpl == (sexp)0x53e) &&
         (psVar1 = (from->value).type.name, psVar1 != ls)) &&
        ((((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x16)))) &&
       (psVar1 = sexp_memq_op(ctx,(sexp)0x0,2,psVar1,ls), psVar1 == (sexp)&DAT_0000003e)) {
      sexp_warn(ctx,"reference to undefined variable: ",(from->value).type.name);
    }
  }
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_warn_undefs_op (sexp ctx, sexp self, sexp_sint_t n, sexp from, sexp to, sexp res) {
  sexp x, ignore = (res && sexp_exceptionp(res)) ? sexp_exception_irritants(res) : SEXP_NULL;
  if (sexp_envp(from)) from = sexp_env_bindings(from);
  for (x=from; sexp_pairp(x) && x!=to; x=sexp_env_next_cell(x))
    if (sexp_cdr(x) == SEXP_UNDEF && sexp_car(x) != ignore
        && !sexp_synclop(sexp_car(x))
        && sexp_not(sexp_memq(ctx, sexp_car(x), ignore)))
      sexp_warn(ctx, "reference to undefined variable: ", sexp_car(x));
  return SEXP_VOID;
}